

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::construct_storage(torrent *this)

{
  byte bVar1;
  bool v1_torrent;
  bool v2_torrent;
  int iVar2;
  element_type *peVar3;
  file_storage *f;
  file_storage *pfVar4;
  file_storage *pfVar5;
  undefined4 extraout_var;
  shared_ptr<libtorrent::torrent_info> *this_00;
  file_storage *local_c8;
  enable_shared_from_this<libtorrent::aux::torrent> local_98;
  shared_ptr<void> local_88;
  storage_holder local_78;
  sha1_hash local_64;
  undefined1 local_50 [8];
  storage_params params;
  torrent *this_local;
  
  params._56_8_ = this;
  peVar3 = ::std::
           __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&(this->super_torrent_hot_members).m_torrent_file);
  f = torrent_info::orig_files(peVar3);
  peVar3 = ::std::
           __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&(this->super_torrent_hot_members).m_torrent_file);
  pfVar4 = torrent_info::orig_files(peVar3);
  peVar3 = ::std::
           __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&(this->super_torrent_hot_members).m_torrent_file);
  pfVar5 = torrent_info::files(peVar3);
  if (pfVar4 == pfVar5) {
    local_c8 = (file_storage *)0x0;
  }
  else {
    peVar3 = ::std::
             __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->super_torrent_hot_members).m_torrent_file);
    local_c8 = torrent_info::files(peVar3);
  }
  bVar1 = this->field_0x5c0;
  info_hash_t::get_best(&local_64,&this->m_info_hash);
  this_00 = &(this->super_torrent_hot_members).m_torrent_file;
  peVar3 = ::std::
           __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this_00);
  v1_torrent = torrent_info::v1(peVar3);
  peVar3 = ::std::
           __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this_00);
  v2_torrent = torrent_info::v2(peVar3);
  storage_params::storage_params
            ((storage_params *)local_50,f,local_c8,&this->m_save_path,bVar1 >> 4 & 3,
             &this->m_file_priority,&local_64,v1_torrent,v2_torrent);
  iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [4])();
  ::std::enable_shared_from_this<libtorrent::aux::torrent>::shared_from_this(&local_98);
  ::std::shared_ptr<void>::shared_ptr<libtorrent::aux::torrent,void>
            (&local_88,(shared_ptr<libtorrent::aux::torrent> *)&local_98);
  (*(code *)**(undefined8 **)CONCAT44(extraout_var,iVar2))
            (&local_78,(undefined8 *)CONCAT44(extraout_var,iVar2),(storage_params *)local_50,
             &local_88);
  storage_holder::operator=(&this->m_storage,&local_78);
  storage_holder::~storage_holder(&local_78);
  ::std::shared_ptr<void>::~shared_ptr(&local_88);
  ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
            ((shared_ptr<libtorrent::aux::torrent> *)&local_98);
  return;
}

Assistant:

void torrent::construct_storage()
	{
		storage_params params{
			m_torrent_file->orig_files(),
			&m_torrent_file->orig_files() != &m_torrent_file->files()
				? &m_torrent_file->files() : nullptr,
			m_save_path,
			static_cast<storage_mode_t>(m_storage_mode),
			m_file_priority,
			m_info_hash.get_best(),
			m_torrent_file->v1(),
			m_torrent_file->v2()
		};

		// the shared_from_this() will create an intentional
		// cycle of ownership, se the hpp file for description.
		m_storage = m_ses.disk_thread().new_torrent(params, shared_from_this());
	}